

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O1

void add_table(ecs_world_t *world,ecs_query_t *query,ecs_table_t *table)

{
  int iVar1;
  ecs_vector_t **ppeVar2;
  _Bool _Var3;
  uint uVar4;
  int32_t iVar5;
  uint uVar6;
  int32_t iVar7;
  void *pvVar8;
  ulong component;
  uint *puVar9;
  ulong uVar10;
  int *piVar11;
  undefined8 *puVar12;
  ecs_ref_t *peVar13;
  ecs_type_t peVar14;
  long *plVar15;
  ecs_vector_t *peVar16;
  ecs_entity_t *peVar17;
  ecs_vector_t *index;
  char *pcVar18;
  char *pcVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  ecs_matched_table_t *peVar25;
  ulong uVar26;
  bool bVar27;
  byte bVar28;
  ecs_type_t local_148;
  ecs_vector_t *local_128;
  int local_11c;
  ecs_vector_t *local_118;
  void *local_110;
  ulong local_108;
  void *local_100;
  ecs_query_t *local_f8;
  ecs_vector_t *local_f0;
  ulong local_e8;
  ulong local_e0;
  int local_d4;
  int local_d0;
  uint local_cc;
  ecs_vector_t **local_c8;
  ecs_vector_t **local_c0;
  ulong *local_b8;
  ulong local_b0;
  void *local_a8;
  ecs_matched_table_t local_a0;
  ecs_table_event_t local_50;
  
  bVar28 = 0;
  uVar4 = ecs_vector_count((query->sig).columns);
  uVar26 = (ulong)uVar4;
  if (table == (ecs_table_t *)0x0) {
    local_148 = (ecs_type_t)0x0;
  }
  else {
    local_148 = table->type;
  }
  local_cc = count_traits(query,local_148);
  if (local_cc == 0) {
    local_100 = (void *)0x0;
  }
  else {
    local_100 = (*ecs_os_api.calloc_)(uVar4 * 8);
  }
  local_d0 = uVar4 * 4;
  local_d4 = uVar4 * 8;
  local_c8 = &query->empty_tables;
  local_c0 = &query->tables;
  if ((int)local_cc < 2) {
    local_cc = 1;
  }
  local_108 = 0;
  local_110 = (void *)0x0;
  local_e0 = 0;
  local_f8 = query;
  local_e8 = uVar26;
  local_b0 = uVar26;
  do {
    local_a0.monitor = (int32_t *)0x0;
    local_a0.rank = 0;
    local_a0._76_4_ = 0;
    local_a0.sparse_columns = (ecs_vector_t *)0x0;
    local_a0.bitset_columns = (ecs_vector_t *)0x0;
    local_a0.iter_data.types = (ecs_type_t *)0x0;
    local_a0.iter_data.references = (ecs_ref_t *)0x0;
    local_a0.iter_data.data = (ecs_data_t *)0x0;
    local_a0.iter_data.components = (ecs_entity_t *)0x0;
    local_a0.iter_data.columns = (int32_t *)0x0;
    if (table != (ecs_table_t *)0x0) {
      local_148 = table->type;
    }
    local_a0.iter_data.table = table;
    group_table(world,query,&local_a0);
    if ((int)uVar26 != 0) {
      local_a0.iter_data.columns = (int32_t *)(*ecs_os_api.malloc_)(local_d0);
      _ecs_assert(local_a0.iter_data.columns != (int32_t *)0x0,0x11,(char *)0x0,
                  "table_data.iter_data.columns != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x2ad);
      iVar1 = local_d4;
      if (local_a0.iter_data.columns == (int32_t *)0x0) {
        __assert_fail("table_data.iter_data.columns != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x2ad,"void add_table(ecs_world_t *, ecs_query_t *, ecs_table_t *)");
      }
      local_a0.iter_data.components = (ecs_entity_t *)(*ecs_os_api.malloc_)(local_d4);
      _ecs_assert(local_a0.iter_data.components != (ecs_entity_t *)0x0,0x11,(char *)0x0,
                  "table_data.iter_data.components != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x2b2);
      if (local_a0.iter_data.components == (ecs_entity_t *)0x0) {
        __assert_fail("table_data.iter_data.components != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x2b2,"void add_table(ecs_world_t *, ecs_query_t *, ecs_table_t *)");
      }
      local_a0.iter_data.types = (ecs_type_t *)(*ecs_os_api.malloc_)(iVar1);
      _ecs_assert(local_a0.iter_data.types != (ecs_type_t *)0x0,0x11,(char *)0x0,
                  "table_data.iter_data.types != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x2b6);
      if (local_a0.iter_data.types == (ecs_type_t *)0x0) {
        __assert_fail("table_data.iter_data.types != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x2b6,"void add_table(ecs_world_t *, ecs_query_t *, ecs_table_t *)");
      }
    }
    pvVar8 = _ecs_vector_first((query->sig).columns,0x28,0x10);
    if ((int)uVar26 < 1) {
      peVar16 = (ecs_vector_t *)0x0;
    }
    else {
      local_11c = (int)local_e0 + 1;
      uVar26 = 0;
      peVar16 = (ecs_vector_t *)0x0;
      local_a8 = pvVar8;
      do {
        pvVar8 = local_a8;
        iVar1 = *(int *)((long)local_a8 + uVar26 * 0x28 + 4);
        uVar4 = 5;
        if (iVar1 != 2) {
          uVar4 = *(uint *)((long)local_a8 + uVar26 * 0x28);
        }
        local_a0.iter_data.columns[uVar26] = 0;
        local_128 = (ecs_vector_t *)0x0;
        if (iVar1 == 2) {
          local_128 = *(ecs_vector_t **)((long)local_a8 + uVar26 * 0x28 + 0x18);
        }
        if (uVar4 < 3) {
code_r0x0011b7f0:
          switch(iVar1) {
          case 0:
          case 2:
          case 3:
            component = *(ecs_entity_t *)((long)local_a8 + uVar26 * 0x28 + 0x10);
            break;
          case 1:
            component = ecs_type_contains(world,local_148,
                                          *(ecs_type_t *)((long)local_a8 + uVar26 * 0x28 + 0x10),
                                          false,true);
            break;
          case 4:
            component = *(ulong *)((long)local_a8 + uVar26 * 0x28 + 0x10) & 0xffffffffffffff;
            break;
          default:
            component = 0;
          }
          if (uVar4 == 6) {
            local_128 = *(ecs_vector_t **)((long)pvVar8 + uVar26 * 0x28 + 0x18);
          }
        }
        else if (uVar4 == 5) {
          component = *(ulong *)((long)local_a8 + uVar26 * 0x28 + 0x10);
        }
        else {
          if (uVar4 == 6) goto code_r0x0011b7f0;
          if ((uVar4 & 0xfffffffb) == 3) {
            if (iVar1 != 3) {
              if (iVar1 == 1) {
                component = components_contains(world,local_148,
                                                *(ecs_type_t *)
                                                 ((long)local_a8 + uVar26 * 0x28 + 0x10),
                                                (ecs_entity_t *)&local_128,false);
                goto LAB_0011b8a2;
              }
              if (iVar1 != 0) goto LAB_0011b9f2;
            }
            component = *(ecs_entity_t *)((long)local_a8 + uVar26 * 0x28 + 0x10);
            local_128 = (ecs_vector_t *)
                        ecs_find_in_type(world,local_148,component,0xfd00000000000000);
          }
          else if (uVar4 == 4) {
            if (iVar1 == 0) {
              component = *(ulong *)((long)local_a8 + uVar26 * 0x28 + 0x10);
            }
            else {
              component = 0;
            }
            local_128 = (ecs_vector_t *)local_f8->system;
          }
          else {
LAB_0011b9f2:
            component = 0;
          }
        }
LAB_0011b8a2:
        pvVar8 = local_100;
        index = local_128;
        if (uVar4 != 5 && local_128 == (ecs_vector_t *)0x0) {
          local_118 = local_128;
          local_f0 = peVar16;
          if (component == 0) {
            uVar10 = 0;
            iVar22 = 0;
          }
          else {
            uVar10 = component;
            if ((component & 0xff00000000000000) == 0xfa00000000000000) {
              uVar20 = component & 0xffffffffffffff;
              if (uVar20 >> 0x20 != 0) {
                if ((int)component == 0x11b) {
                  _ecs_assert(local_100 != (void *)0x0,0xc,(char *)0x0,"trait_offsets != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                              ,0x19f);
                  iVar22 = local_11c;
                  if (pvVar8 == (void *)0x0) {
                    __assert_fail("trait_offsets != ((void*)0)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                  ,0x19f,
                                  "int32_t get_component_index(ecs_world_t *, ecs_table_t *, ecs_type_t, ecs_entity_t *, int32_t, ecs_sig_oper_kind_t, trait_offset_t *, int32_t)"
                                 );
                  }
                  iVar23 = *(int *)((long)pvVar8 + uVar26 * 8);
                  if (*(int *)((long)pvVar8 + uVar26 * 8 + 4) == local_11c) {
                    iVar5 = iVar23 + -1;
                  }
                  else {
                    iVar5 = ecs_type_trait_index_of(local_148,iVar23,uVar20 >> 0x20);
                    *(int32_t *)((long)pvVar8 + uVar26 * 8) = iVar5 + 1;
                    *(int *)((long)pvVar8 + uVar26 * 8 + 4) = iVar22;
                  }
                  _ecs_assert(iVar5 != -1,0xc,(char *)0x0,"result != -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                              ,0x1ae);
                  if (iVar5 == -1) {
                    __assert_fail("result != -1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                  ,0x1ae,
                                  "int32_t get_component_index(ecs_world_t *, ecs_table_t *, ecs_type_t, ecs_entity_t *, int32_t, ecs_sig_oper_kind_t, trait_offset_t *, int32_t)"
                                 );
                  }
                  puVar9 = (uint *)_ecs_vector_get(local_148,8,0x10,iVar5);
                  _ecs_assert(puVar9 != (uint *)0x0,0xc,(char *)0x0,"trait != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                              ,0x1b3);
                  if (puVar9 == (uint *)0x0) {
                    __assert_fail("trait != ((void*)0)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                  ,0x1b3,
                                  "int32_t get_component_index(ecs_world_t *, ecs_table_t *, ecs_type_t, ecs_entity_t *, int32_t, ecs_sig_oper_kind_t, trait_offset_t *, int32_t)"
                                 );
                  }
                  uVar10 = (ulong)*puVar9;
                }
                goto LAB_0011bbb5;
              }
              _ecs_assert(local_100 != (void *)0x0,0xc,(char *)0x0,"trait_offsets != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                          ,0x17f);
              if (pvVar8 == (void *)0x0) {
                __assert_fail("trait_offsets != ((void*)0)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                              ,0x17f,
                              "int32_t get_component_index(ecs_world_t *, ecs_table_t *, ecs_type_t, ecs_entity_t *, int32_t, ecs_sig_oper_kind_t, trait_offset_t *, int32_t)"
                             );
              }
              iVar22 = *(int *)((long)pvVar8 + uVar26 * 8);
              if (*(int *)((long)pvVar8 + uVar26 * 8 + 4) == local_11c) {
                iVar5 = iVar22 + -1;
              }
              else {
                iVar5 = ecs_type_trait_index_of(local_148,iVar22,uVar20);
                *(int32_t *)((long)pvVar8 + uVar26 * 8) = iVar5 + 1;
                *(int *)((long)pvVar8 + uVar26 * 8 + 4) = local_11c;
              }
              uVar10 = uVar20;
              if (iVar5 == -1) {
                iVar5 = -1;
              }
              else {
                local_b8 = (ulong *)_ecs_vector_get(local_148,8,0x10,iVar5);
                component = *local_b8;
                pvVar8 = ecs_get_w_entity(world,uVar20,1);
                if (pvVar8 == (void *)0x0) {
                  uVar10 = (ulong)(uint)*local_b8;
                }
              }
            }
            else if ((component & 0xff00000000000000) == 0xfc00000000000000) {
              iVar5 = ecs_table_switch_from_case(world,table,component);
              _ecs_assert(iVar5 != -1,0xc,(char *)0x0,"result != -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                          ,0x175);
              if (iVar5 == -1) {
                __assert_fail("result != -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                              ,0x175,
                              "int32_t get_component_index(ecs_world_t *, ecs_table_t *, ecs_type_t, ecs_entity_t *, int32_t, ecs_sig_oper_kind_t, trait_offset_t *, int32_t)"
                             );
              }
              iVar5 = iVar5 + table->sw_column_offset;
            }
            else {
LAB_0011bbb5:
              iVar5 = ecs_type_index_of(local_148,uVar10);
              component = uVar10;
            }
            iVar22 = iVar5 + 1;
            if (iVar5 + 1 == 0) {
              iVar22 = -1;
            }
            if (((uVar10 & 0xff00000000000000) != 0xfb00000000000000) &&
               ((uVar10 & 0xff00000000000000) != 0xfc00000000000000)) {
              uVar10 = ecs_get_typeid(world,uVar10);
              piVar11 = (int *)ecs_get_w_entity(world,uVar10,1);
              if ((piVar11 == (int *)0x0) || (*piVar11 == 0)) {
                iVar22 = 0;
              }
            }
          }
          iVar23 = 0;
          if (((iVar1 != 4) && (iVar23 = iVar22, iVar1 == 3)) &&
             (_Var3 = ecs_type_has_entity(world,local_148,uVar10), !_Var3)) {
            iVar23 = 0;
          }
          index = local_118;
          if (iVar23 == -1) {
            iVar23 = -(uint)(iVar1 != 3 || uVar4 != 1);
          }
          else if (iVar1 == 3 && uVar4 == 2) {
            iVar23 = 0;
          }
          local_a0.iter_data.columns[uVar26] = iVar23;
          if ((component & 0xff00000000000000) == 0xfc00000000000000) {
            puVar12 = (undefined8 *)_ecs_vector_add(&local_a0.sparse_columns,0x18,0x10);
            *(int *)(puVar12 + 2) = (int)uVar26;
            puVar12[1] = component & 0xffffffffffffff;
            *puVar12 = 0;
          }
          peVar16 = local_f0;
          if (((iVar23 != 0) && ((table->flags & 0x20000) != 0)) &&
             (iVar5 = ecs_type_index_of(table->type,
                                        component & 0xffffffffffffff | 0xf400000000000000),
             iVar5 != -1)) {
            puVar12 = (undefined8 *)_ecs_vector_add(&local_a0.bitset_columns,0x10,0x10);
            *(int32_t *)(puVar12 + 1) = iVar5;
            *puVar12 = 0;
          }
        }
        if (((index != (ecs_vector_t *)0x0) || (uVar4 == 7)) ||
           (local_a0.iter_data.columns[uVar26] == -1)) {
          local_128 = peVar16;
          local_f0 = (ecs_vector_t *)ecs_get_w_entity(world,component,1);
          peVar13 = (ecs_ref_t *)_ecs_vector_add(&local_128,0x30,0x10);
          if (((1 < uVar4 - 5) && (uVar4 != 4)) && (uVar4 != 7)) {
            peVar16 = local_148;
            if (index != (ecs_vector_t *)0x0) {
              plVar15 = (long *)_ecs_sparse_get_sparse
                                          ((world->store).entity_index,0x10,(uint64_t)index);
              _ecs_assert(plVar15 != (long *)0x0,0xc,(char *)0x0,"record != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                          ,0x38);
              if (plVar15 == (long *)0x0) {
                __assert_fail("record != ((void*)0)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                              ,0x38,
                              "ecs_entity_t get_entity_for_component(ecs_world_t *, ecs_entity_t, ecs_type_t, ecs_entity_t)"
                             );
              }
              if ((undefined8 *)*plVar15 == (undefined8 *)0x0) {
                peVar16 = (ecs_vector_t *)0x0;
              }
              else {
                peVar16 = *(ecs_vector_t **)*plVar15;
              }
            }
            local_118 = index;
            uVar6 = ecs_vector_count(peVar16);
            peVar17 = (ecs_entity_t *)_ecs_vector_first(peVar16,8,0x10);
            bVar27 = 0 < (int)uVar6;
            index = peVar16;
            if ((0 < (int)uVar6) && (bVar27 = true, index = local_118, *peVar17 != component)) {
              uVar20 = (ulong)uVar6;
              uVar10 = 0;
              do {
                uVar24 = uVar20;
                if (uVar20 - 1 == uVar10) break;
                lVar21 = uVar10 + 1;
                uVar24 = uVar10 + 1;
                uVar10 = uVar24;
              } while (peVar17[lVar21] != component);
              bVar27 = uVar24 < uVar20;
            }
            if (!bVar27) {
              index = (ecs_vector_t *)
                      ecs_find_entity_in_prefabs(world,(ecs_entity_t)local_118,peVar16,component,0);
            }
          }
          if ((uVar4 != 7) &&
             (_ecs_assert(index != (ecs_vector_t *)0x0,0xc,(char *)0x0,"e != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                          ,0x209), index == (ecs_vector_t *)0x0)) {
            __assert_fail("e != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                          ,0x209,
                          "ecs_vector_t *add_ref(ecs_world_t *, ecs_query_t *, ecs_type_t, ecs_vector_t *, ecs_entity_t, ecs_entity_t, ecs_sig_from_kind_t)"
                         );
          }
          peVar13->entity = 0;
          peVar13->component = 0;
          peVar13->record = (ecs_record_t *)0x0;
          peVar13->ptr = (void *)0x0;
          peVar13->table = (void *)0x0;
          peVar13->row = 0;
          peVar13->alloc_count = 0;
          peVar13->entity = (ecs_entity_t)index;
          peVar13->component = component;
          _Var3 = ecs_has_type(world,component,FLECS__TEcsComponent);
          if (((_Var3) && (uVar4 != 5)) && (local_f0->count != 0)) {
            if (index != (ecs_vector_t *)0x0) {
              ecs_get_ref_w_entity(world,peVar13,(ecs_entity_t)index,component);
              ecs_set_watch(world,(ecs_entity_t)index);
            }
            *(byte *)&local_f8->flags = (byte)local_f8->flags | 0x40;
          }
          peVar16 = local_128;
          iVar5 = ecs_vector_count(local_128);
          local_a0.iter_data.columns[uVar26] = -iVar5;
        }
        local_a0.iter_data.components[uVar26] = component;
        if (iVar1 == 4) {
          pvVar8 = ecs_get_w_entity(world,component,3);
          _ecs_assert(pvVar8 != (void *)0x0,2,(char *)0x0,"type != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x277);
          if (pvVar8 == (void *)0x0) {
            __assert_fail("type != ((void*)0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                          ,0x277,
                          "ecs_type_t get_column_type(ecs_world_t *, ecs_sig_oper_kind_t, ecs_entity_t)"
                         );
          }
          peVar14 = *(ecs_type_t *)((long)pvVar8 + 8);
        }
        else {
          peVar14 = ecs_type_from_entity(world,component);
        }
        local_a0.iter_data.types[uVar26] = peVar14;
        uVar26 = uVar26 + 1;
      } while (uVar26 != local_b0);
    }
    ppeVar2 = local_c0;
    query = local_f8;
    if ((table == (ecs_table_t *)0x0) || ((local_f8->flags & 0xe) != 0)) {
      puVar12 = (undefined8 *)_ecs_vector_add(local_c0,0x50,0x10);
      iVar5 = ecs_vector_count(*ppeVar2);
      _ecs_assert(0 < iVar5,0xc,(char *)0x0,"matched_table_index >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x335);
      if (iVar5 < 1) {
        __assert_fail("matched_table_index >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x335,"void add_table(ecs_world_t *, ecs_query_t *, ecs_table_t *)");
      }
      iVar5 = iVar5 + -1;
    }
    else {
      puVar12 = (undefined8 *)_ecs_vector_add(local_c8,0x50,0x10);
      iVar5 = ecs_vector_count(query->empty_tables);
      iVar1 = (int)local_108;
      local_110 = (*ecs_os_api.realloc_)(local_110,iVar1 * 4 + 4);
      *(int32_t *)((long)local_110 + (long)iVar1 * 4) = -iVar5;
      pcVar18 = ecs_type_str(world,table->type);
      if (query->system == 0) {
        pcVar19 = (query->sig).expr;
      }
      else {
        pcVar19 = ecs_get_name(world,query->system);
      }
      local_108 = (ulong)((int)local_108 + 1);
      _ecs_trace(2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                 ,0x327,"query #[green]%s#[reset] matched with table #[green][%s]",pcVar19,pcVar18);
      (*ecs_os_api.free_)(pcVar18);
    }
    uVar26 = local_e8;
    if (peVar16 != (ecs_vector_t *)0x0) {
      iVar7 = ecs_vector_count(peVar16);
      peVar13 = (ecs_ref_t *)(*ecs_os_api.malloc_)(iVar7 * 0x30);
      local_a0.iter_data.references = peVar13;
      pvVar8 = _ecs_vector_first(peVar16,0x30,0x10);
      uVar26 = local_e8;
      query = local_f8;
      memcpy(peVar13,pvVar8,(long)(iVar7 * 0x30));
      ecs_vector_free(peVar16);
    }
    peVar25 = &local_a0;
    for (lVar21 = 10; lVar21 != 0; lVar21 = lVar21 + -1) {
      *puVar12 = (peVar25->iter_data).columns;
      peVar25 = (ecs_matched_table_t *)((long)peVar25 + ((ulong)bVar28 * -2 + 1) * 8);
      puVar12 = puVar12 + (ulong)bVar28 * -2 + 1;
    }
    uVar4 = (int)local_e0 + 1;
    local_e0 = (ulong)uVar4;
    if (uVar4 == local_cc) {
      if (local_110 != (void *)0x0) {
        puVar12 = (undefined8 *)_ecs_map_ensure(query->table_indices,0x10,(ulong)table->id);
        if ((void *)*puVar12 != (void *)0x0) {
          (*ecs_os_api.free_)((void *)*puVar12);
        }
        *puVar12 = local_110;
        *(int *)(puVar12 + 1) = (int)local_108;
      }
      if (table != (ecs_table_t *)0x0) {
        if ((query->flags & 0x100) == 0) {
          local_50.kind = EcsTableQueryMatch;
          local_50.component = 0;
          local_50.query = query;
          local_50.matched_table_index = iVar5;
          ecs_table_notify(world,table,&local_50);
        }
        else {
          iVar5 = ecs_table_count(table);
          if (iVar5 != 0) {
            activate_table(world,query,table,true);
          }
        }
      }
      if (local_100 != (void *)0x0) {
        (*ecs_os_api.free_)(local_100);
      }
      return;
    }
  } while( true );
}

Assistant:

static
void add_table(
    ecs_world_t *world,
    ecs_query_t *query,
    ecs_table_t *table)
{
    ecs_type_t table_type = NULL;
    int32_t c, column_count = ecs_vector_count(query->sig.columns);

    if (table) {
        table_type = table->type;
    }

    int32_t trait_cur = 0, trait_count = count_traits(query, table_type);
    
    /* If the query has traits, we need to account for the fact that a table may
     * have multiple components to which the trait is applied, which means the
     * table has to be registered with the query multiple times, with different
     * table columns. If so, allocate a small array for each trait in which the
     * last added table index of the trait is stored, so that in the next 
     * iteration we can start the search from the correct offset type. */
    trait_offset_t *trait_offsets = NULL;
    if (trait_count) {
        trait_offsets = ecs_os_calloc(
            ECS_SIZEOF(trait_offset_t) * column_count);
    }

    /* From here we recurse */
    int32_t *table_indices = NULL;
    int32_t table_indices_count = 0;
    int32_t matched_table_index = 0;
    ecs_matched_table_t table_data;
    ecs_vector_t *references = NULL;

add_trait:
    table_data = (ecs_matched_table_t){ .iter_data.table = table };
    if (table) {
        table_type = table->type;
    }

    /* If grouping is enabled for query, assign the group rank to the table */
    group_table(world, query, &table_data);

    if (column_count) {
        /* Array that contains the system column to table column mapping */
        table_data.iter_data.columns = ecs_os_malloc(ECS_SIZEOF(int32_t) * column_count);
        ecs_assert(table_data.iter_data.columns != NULL, ECS_OUT_OF_MEMORY, NULL);

        /* Store the components of the matched table. In the case of OR expressions,
        * components may differ per matched table. */
        table_data.iter_data.components = ecs_os_malloc(ECS_SIZEOF(ecs_entity_t) * column_count);
        ecs_assert(table_data.iter_data.components != NULL, ECS_OUT_OF_MEMORY, NULL);

        /* Also cache types, so no lookup is needed while iterating */
        table_data.iter_data.types = ecs_os_malloc(ECS_SIZEOF(ecs_type_t) * column_count);
        ecs_assert(table_data.iter_data.types != NULL, ECS_OUT_OF_MEMORY, NULL);        
    }

    /* Walk columns parsed from the system signature */
    ecs_sig_column_t *columns = ecs_vector_first(
        query->sig.columns, ecs_sig_column_t);

    for (c = 0; c < column_count; c ++) {
        ecs_sig_column_t *column = &columns[c];
        ecs_entity_t entity = 0, component = 0;
        ecs_sig_oper_kind_t op = column->oper_kind;
        ecs_sig_from_kind_t from = column->from_kind;

        if (op == EcsOperNot) {
            from = EcsFromEmpty;
        }

        table_data.iter_data.columns[c] = 0;

        /* Get actual component and component source for current column */
        get_comp_and_src(world, query, table_type, column, op, from, &component, 
            &entity);

        /* This column does not retrieve data from a static entity (either
         * EcsFromSystem or EcsFromParent) and is not just a handle */
        if (!entity && from != EcsFromEmpty) {
            int32_t index = get_component_index(world, table, table_type, 
                &component, c, op, trait_offsets, trait_cur + 1);

            if (index == -1) {
                if (from == EcsFromOwned && op == EcsOperOptional) {
                    index = 0;
                }
            } else {
                if (from == EcsFromShared && op == EcsOperOptional) {
                    index = 0;
                }
            }

            table_data.iter_data.columns[c] = index;

            /* If the column is a case, we should only iterate the entities in
             * the column for this specific case. Add a sparse column with the
             * case id so we can find the correct entities when iterating */
            if (ECS_HAS_ROLE(component, CASE)) {
                ecs_sparse_column_t *sc = ecs_vector_add(
                    &table_data.sparse_columns, ecs_sparse_column_t);
                sc->signature_column_index = c;
                sc->sw_case = component & ECS_COMPONENT_MASK;
                sc->sw_column = NULL;
            }

            /* If table has a disabled bitmask for components, check if there is
             * a disabled column for the queried for component. If so, cache it
             * in a vector as the iterator will need to skip the entity when the
             * component is disabled. */
            if (index && (table->flags & EcsTableHasDisabled)) {
                ecs_entity_t bs_id = 
                    (component & ECS_COMPONENT_MASK) | ECS_DISABLED;
                int32_t bs_index = ecs_type_index_of(table->type, bs_id);
                if (bs_index != -1) {
                    ecs_bitset_column_t *elem = ecs_vector_add(
                        &table_data.bitset_columns, ecs_bitset_column_t);
                    elem->column_index = bs_index;
                    elem->bs_column = NULL;
                }
            }
        }

        /* Check if a the component is a reference. If 'entity' is set, the
         * component must be resolved from another entity, which is the case
         * for FromEntity and FromContainer. 
         * 
         * If no entity is set but the component is not found in the table, it
         * must come from a prefab. This is guaranteed, as at this point it is
         * already validated that the table matches with the system.
         * 
         * If the column from is Cascade, there may not be an entity in case the
         * current table contains root entities. In that case, still add a
         * reference field. The application can, after the table has matched,
         * change the set of components, so that this column will turn into a
         * reference. Having the reference already linked to the system table
         * makes changing this administation easier when the change happens.
         */
        if ((entity || table_data.iter_data.columns[c] == -1 || from == EcsCascade)) {
            references = add_ref(world, query, table_type, references, 
                component, entity, from);
            table_data.iter_data.columns[c] = -ecs_vector_count(references);
        }

        table_data.iter_data.components[c] = component;
        table_data.iter_data.types[c] = get_column_type(world, op, component);
    }

    /* Initially always add table to inactive group. If the system is registered
     * with the table and the table is not empty, the table will send an
     * activate signal to the system. */

    ecs_matched_table_t *table_elem;
    if (table && has_auto_activation(query)) {
        table_elem = ecs_vector_add(&query->empty_tables, 
            ecs_matched_table_t);

        /* Store table index */
        matched_table_index = ecs_vector_count(query->empty_tables);
        table_indices_count ++;
        table_indices = ecs_os_realloc(
            table_indices, table_indices_count * ECS_SIZEOF(int32_t));
        table_indices[table_indices_count - 1] = -matched_table_index;

        #ifndef NDEBUG
        char *type_expr = ecs_type_str(world, table->type);
        ecs_trace_2("query #[green]%s#[reset] matched with table #[green][%s]",
            query_name(world, query), type_expr);
        ecs_os_free(type_expr);
        #endif
    } else {
        /* If no table is provided to function, this is a system that contains
         * no columns that require table matching. In this case, the system will
         * only have one "dummy" table that caches data from the system columns.
         * Always add this dummy table to the list of active tables, since it
         * would never get activated otherwise. */
        table_elem = ecs_vector_add(&query->tables, ecs_matched_table_t);

        /* If query doesn't automatically activates/inactivates tables, we can 
         * get the count to determine the current table index. */
        matched_table_index = ecs_vector_count(query->tables) - 1;
        ecs_assert(matched_table_index >= 0, ECS_INTERNAL_ERROR, NULL);
    }

    if (references) {
        ecs_size_t ref_size = ECS_SIZEOF(ecs_ref_t) * ecs_vector_count(references);
        table_data.iter_data.references = ecs_os_malloc(ref_size);
        ecs_os_memcpy(table_data.iter_data.references, 
            ecs_vector_first(references, ecs_ref_t), ref_size);
        ecs_vector_free(references);
        references = NULL;
    }

    *table_elem = table_data;

    /* Use tail recursion when adding table for multiple traits */
    trait_cur ++;
    if (trait_cur < trait_count) {
        goto add_trait;
    }

    /* Register table indices before sending out the match signal. This signal
     * can cause table activation, and table indices are needed for that. */
    if (table_indices) {
        ecs_table_indices_t *ti = ecs_map_ensure(
            query->table_indices, ecs_table_indices_t, table->id);
        if (ti->indices) {
            ecs_os_free(ti->indices);
        }
        ti->indices = table_indices;
        ti->count = table_indices_count;
    }

    if (table && !(query->flags & EcsQueryIsSubquery)) {
        ecs_table_notify(world, table, &(ecs_table_event_t){
            .kind = EcsTableQueryMatch,
            .query = query,
            .matched_table_index = matched_table_index
        });
    } else if (table && ecs_table_count(table)) {
        activate_table(world, query, table, true);
    }

    if (trait_offsets) {
        ecs_os_free(trait_offsets);
    }
}